

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuSeedBuilder.cpp
# Opt level: O2

SeedBuilder * tcu::operator<<(SeedBuilder *builder,deInt16 value)

{
  deUint8 data [2];
  
  data = (deUint8  [2])(value ^ 0x22b);
  SeedBuilder::feed(builder,2,data);
  return builder;
}

Assistant:

SeedBuilder& operator<< (SeedBuilder& builder, deInt16 value)
{
	const deInt16	val		= value ^ 555;
	const deUint8	data[]	=
	{
		(deUint8)(((deUint16)val) & 0xFFu),
		(deUint8)(((deUint16)val) >> 8),
	};

	builder.feed(sizeof(data), data);
	return builder;
}